

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

void __thiscall
ImageT<unsigned_char,_4U>::ImageT(ImageT<unsigned_char,_4U> *this,uint32_t w,uint32_t h)

{
  Color *pCVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  (this->super_Image).width = w;
  (this->super_Image).height = h;
  (this->super_Image).transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
  (this->super_Image).primaries = KHR_DF_PRIMARIES_BT709;
  (this->super_Image)._vptr_Image = (_func_int **)&PTR__ImageT_001b2f48;
  pCVar1 = (Color *)malloc((ulong)h * (ulong)w * 4);
  this->pixels = pCVar1;
  if (pCVar1 != (Color *)0x0) {
    this->freePixels = true;
    if (h * w != 0) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        lVar5 = 0;
        do {
          (this->pixels->field_0).comps[lVar5 + lVar3] = '\0';
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 4;
      } while (uVar4 != h * w);
    }
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::ios::widen;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

ImageT(uint32_t w, uint32_t h) : Image(w, h)
    {
        size_t bytes = sizeof(Color) * w * h;
        pixels = (Color*)malloc(bytes);
        if (!pixels)
            throw std::bad_alloc();

        freePixels = true;

        for (uint32_t p = 0; p < w * h; ++p)
            for(uint32_t c = 0; c < componentCount; ++c)
                pixels[p].comps[c] = componentType{0};
    }